

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O2

Expression __thiscall cnn::Cluster::get_bias(Cluster *this,ComputationGraph *cg)

{
  Parameters *pPVar1;
  Parameters *in_RDX;
  Expression EVar2;
  Parameters *local_28;
  undefined4 local_20;
  
  pPVar1 = (Parameters *)cg[2].ee;
  if (pPVar1 == in_RDX) {
    local_20 = *(undefined4 *)
                &cg[3].nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  }
  else {
    EVar2 = cnn::expr::parameter((ComputationGraph *)&stack0xffffffffffffffd8,in_RDX);
    in_RDX = EVar2._8_8_;
    cg[2].ee = (ExecutionEngine *)local_28;
    *(undefined4 *)
     &cg[3].nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = local_20;
    pPVar1 = local_28;
  }
  (this->children).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pPVar1;
  *(undefined4 *)
   &(this->children).super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
    super__Vector_impl_data._M_finish = local_20;
  EVar2._8_8_ = in_RDX;
  EVar2.pg = (ComputationGraph *)this;
  return EVar2;
}

Assistant:

Expression Cluster::get_bias(ComputationGraph& cg) const {
  if (bias.pg != &cg) {
    bias = parameter(cg, p_bias);
  }
  return bias;
}